

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

void HTS_lsp2lpc(HTS_Vocoder *v,double *lsp,double *a,int m)

{
  double *__s;
  long lVar1;
  uint uVar2;
  double *ptr;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  double *__s_00;
  long lVar6;
  long lVar7;
  double *__s_01;
  double *__s_02;
  size_t sVar8;
  double *__s_03;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if ((m & 1U) == 0) {
    uVar2 = m >> 1;
    uVar4 = uVar2;
  }
  else {
    uVar4 = m + 1 >> 1;
    uVar2 = m + -1 >> 1;
  }
  uVar5 = (ulong)m;
  ptr = v->lsp2lpc_buff;
  if (v->lsp2lpc_size < uVar5) {
    if (ptr != (double *)0x0) {
      HTS_free(ptr);
    }
    ptr = (double *)HTS_calloc((long)(m * 5 + 6),8);
    v->lsp2lpc_buff = ptr;
    v->lsp2lpc_size = uVar5;
  }
  lVar6 = (long)(int)uVar4;
  lVar9 = (long)(int)uVar2;
  __s = ptr + uVar5 + lVar6 + lVar9;
  __s_01 = __s + lVar6 + 1;
  __s_02 = __s_01 + lVar6 + 1;
  if (ptr < lsp) {
    if (m != 0) {
      uVar3 = 0;
      do {
        ptr[uVar3] = lsp[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
  }
  else {
    uVar3 = uVar5;
    if (m != 0) {
      do {
        ptr[uVar3 - 1] = lsp[uVar3 - 1];
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  __s_00 = __s_02 + lVar6 + 1;
  if (-1 < (int)uVar4) {
    sVar8 = (ulong)(uVar4 + 1) << 3;
    memset(__s,0,sVar8);
    memset(__s_01,0,sVar8);
    memset(__s_02,0,sVar8);
  }
  __s_03 = __s_00 + lVar9 + 1;
  if (-1 < (int)uVar2) {
    sVar8 = (ulong)(uVar2 + 1) << 3;
    memset(__s_00,0,sVar8);
    memset(__s_03,0,sVar8);
    memset(ptr + uVar5 + lVar9 * 3 + lVar6 * 4 + 5,0,sVar8);
  }
  if (0 < (int)uVar4) {
    lVar10 = 0;
    do {
      dVar11 = cos(*(double *)((long)v->lsp2lpc_buff + lVar10 * 2));
      *(double *)((long)ptr + lVar10 + uVar5 * 8) = dVar11 * -2.0;
      lVar10 = lVar10 + 8;
    } while ((ulong)uVar4 * 8 != lVar10);
  }
  if (0 < (int)uVar2) {
    lVar10 = 0;
    do {
      dVar11 = cos(*(double *)((long)v->lsp2lpc_buff + lVar10 * 2 + 8));
      *(double *)((long)ptr + lVar10 + lVar6 * 8 + uVar5 * 8) = dVar11 * -2.0;
      lVar10 = lVar10 + 8;
    } while ((ulong)uVar2 * 8 != lVar10);
  }
  if (-1 < m) {
    lVar10 = lVar6 * 8 + lVar9 * 8 + uVar5 * 8;
    lVar1 = lVar6 * 0x20 + lVar9 * 0x18 + uVar5 * 8 + 0x28;
    uVar3 = 0;
    dVar11 = 0.0;
    dVar13 = 0.0;
    dVar14 = 1.0;
    do {
      dVar12 = dVar11;
      dVar15 = dVar13;
      if ((m & 1U) != 0) {
        dVar12 = dVar13;
        dVar13 = -0.0;
        dVar15 = dVar11;
      }
      *__s = dVar13 + dVar14;
      *__s_00 = dVar14 - dVar15;
      if (0 < (int)uVar4) {
        dVar11 = *__s;
        lVar7 = 0;
        do {
          dVar11 = *(double *)((long)ptr + lVar7 + uVar5 * 8) * *(double *)((long)__s_01 + lVar7) +
                   dVar11 + *(double *)((long)__s_02 + lVar7);
          *(double *)((long)ptr + lVar7 + lVar10 + 8) = dVar11;
          *(undefined8 *)((long)__s_02 + lVar7) = *(undefined8 *)((long)__s_01 + lVar7);
          *(undefined8 *)((long)__s_01 + lVar7) = *(undefined8 *)((long)ptr + lVar7 + lVar10);
          lVar7 = lVar7 + 8;
        } while ((ulong)uVar4 << 3 != lVar7);
      }
      if (0 < (int)uVar2) {
        lVar7 = 0;
        do {
          *(double *)((long)__s_00 + lVar7 + 8) =
               *(double *)((long)ptr + lVar7 + lVar6 * 8 + uVar5 * 8) *
               *(double *)((long)__s_03 + lVar7) + *(double *)((long)__s_00 + lVar7) +
               *(double *)((long)ptr + lVar7 + lVar1);
          *(undefined8 *)((long)ptr + lVar7 + lVar1) = *(undefined8 *)((long)__s_03 + lVar7);
          *(undefined8 *)((long)__s_03 + lVar7) = *(undefined8 *)((long)__s_00 + lVar7);
          lVar7 = lVar7 + 8;
        } while ((ulong)uVar2 << 3 != lVar7);
      }
      if (uVar3 != 0) {
        a[uVar3 - 1] = (__s[lVar6] + __s_00[lVar9]) * -0.5;
      }
      uVar3 = uVar3 + 1;
      dVar11 = dVar12;
      dVar13 = dVar14;
      dVar14 = 0.0;
    } while (uVar3 != m + 1);
    if (m != 0) {
      uVar5 = (ulong)(uint)m + 1;
      do {
        a[uVar5 - 1] = -a[uVar5 - 2];
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
  }
  *a = 1.0;
  return;
}

Assistant:

static void HTS_lsp2lpc(HTS_Vocoder * v, double *lsp, double *a, const int m)
{
   int i, k, mh1, mh2, flag_odd;
   double xx, xf, xff;
   double *p, *q;
   double *a0, *a1, *a2, *b0, *b1, *b2;

   flag_odd = 0;
   if (m % 2 == 0)
      mh1 = mh2 = m / 2;
   else {
      mh1 = (m + 1) / 2;
      mh2 = (m - 1) / 2;
      flag_odd = 1;
   }

   if (m > v->lsp2lpc_size) {
      if (v->lsp2lpc_buff != NULL)
         HTS_free(v->lsp2lpc_buff);
      v->lsp2lpc_buff = (double *) HTS_calloc(5 * m + 6, sizeof(double));
      v->lsp2lpc_size = m;
   }
   p = v->lsp2lpc_buff + m;
   q = p + mh1;
   a0 = q + mh2;
   a1 = a0 + (mh1 + 1);
   a2 = a1 + (mh1 + 1);
   b0 = a2 + (mh1 + 1);
   b1 = b0 + (mh2 + 1);
   b2 = b1 + (mh2 + 1);

   HTS_movem(lsp, v->lsp2lpc_buff, m);

   for (i = 0; i < mh1 + 1; i++)
      a0[i] = 0.0;
   for (i = 0; i < mh1 + 1; i++)
      a1[i] = 0.0;
   for (i = 0; i < mh1 + 1; i++)
      a2[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b0[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b1[i] = 0.0;
   for (i = 0; i < mh2 + 1; i++)
      b2[i] = 0.0;

   /* lsp filter parameters */
   for (i = k = 0; i < mh1; i++, k += 2)
      p[i] = -2.0 * cos(v->lsp2lpc_buff[k]);
   for (i = k = 0; i < mh2; i++, k += 2)
      q[i] = -2.0 * cos(v->lsp2lpc_buff[k + 1]);

   /* impulse response of analysis filter */
   xx = 1.0;
   xf = xff = 0.0;

   for (k = 0; k <= m; k++) {
      if (flag_odd) {
         a0[0] = xx;
         b0[0] = xx - xff;
         xff = xf;
         xf = xx;
      } else {
         a0[0] = xx + xf;
         b0[0] = xx - xf;
         xf = xx;
      }

      for (i = 0; i < mh1; i++) {
         a0[i + 1] = a0[i] + p[i] * a1[i] + a2[i];
         a2[i] = a1[i];
         a1[i] = a0[i];
      }

      for (i = 0; i < mh2; i++) {
         b0[i + 1] = b0[i] + q[i] * b1[i] + b2[i];
         b2[i] = b1[i];
         b1[i] = b0[i];
      }

      if (k != 0)
         a[k - 1] = -0.5 * (a0[mh1] + b0[mh2]);
      xx = 0.0;
   }

   for (i = m - 1; i >= 0; i--)
      a[i + 1] = -a[i];
   a[0] = 1.0;
}